

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void progress_meter(Curl_easy *data)

{
  FILE *whereto;
  long seconds;
  curl_off_t cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long local_120;
  long local_110;
  curl_off_t local_108;
  long local_f8;
  curl_off_t cur_secs;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  curl_off_t total_expected_size;
  curl_off_t total_cur_size;
  pgrs_estimate total_estm;
  pgrs_estimate ul_estm;
  pgrs_estimate dl_estm;
  char max5 [6] [10];
  Progress *p;
  Curl_easy *data_local;
  
  seconds = (data->progress).timespent / 1000000;
  if (((data->progress).flags & 0x80U) == 0) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n",
                    (data->state).resume_from);
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    (data->progress).flags = (data->progress).flags | 0x80;
  }
  pgrs_estimates(&(data->progress).ul,((data->progress).flags & 0x20U) != 0,
                 (pgrs_estimate *)&total_estm.percent);
  pgrs_estimates(&(data->progress).dl,((data->progress).flags & 0x40U) != 0,
                 (pgrs_estimate *)&ul_estm.percent);
  if (ul_estm.percent < total_estm.percent) {
    local_f8 = total_estm.percent;
  }
  else {
    local_f8 = ul_estm.percent;
  }
  if (local_f8 < 1) {
    local_108 = 0;
  }
  else {
    local_108 = local_f8 - seconds;
  }
  time2str(time_total + 2,local_108);
  time2str(time_spent + 2,local_f8);
  time2str((char *)((long)&cur_secs + 2),seconds);
  if (((data->progress).flags & 0x20U) == 0) {
    local_110 = (data->progress).ul.cur_size;
  }
  else {
    local_110 = (data->progress).ul.total_size;
  }
  if (((data->progress).flags & 0x40U) == 0) {
    local_120 = (data->progress).dl.cur_size;
  }
  else {
    local_120 = (data->progress).dl.total_size;
  }
  cVar1 = pgrs_est_percent(local_110 + local_120,
                           (data->progress).dl.cur_size + (data->progress).ul.cur_size);
  whereto = (data->set).err;
  total_estm.secs = cVar1;
  pcVar2 = max5data(local_110 + local_120,max5[1] + 2);
  pcVar3 = max5data((data->progress).dl.cur_size,(char *)&dl_estm.percent);
  pcVar4 = max5data((data->progress).ul.cur_size,max5[0] + 2);
  pcVar5 = max5data((data->progress).dl.speed,max5[2] + 2);
  pcVar6 = max5data((data->progress).ul.speed,max5[3] + 2);
  pcVar7 = max5data((data->progress).current_speed,max5[4] + 2);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",cVar1,pcVar2,dl_estm.secs,
                pcVar3,ul_estm.secs,pcVar4,pcVar5,pcVar6,time_spent + 2,(long)&cur_secs + 2,
                time_total + 2,pcVar7);
  fflush((FILE *)(data->set).err);
  return;
}

Assistant:

static void progress_meter(struct Curl_easy *data)
{
  struct Progress *p = &data->progress;
  char max5[6][10];
  struct pgrs_estimate dl_estm;
  struct pgrs_estimate ul_estm;
  struct pgrs_estimate total_estm;
  curl_off_t total_cur_size;
  curl_off_t total_expected_size;
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t cur_secs = (curl_off_t)p->timespent/1000000; /* seconds */

  if(!(p->flags & PGRS_HEADERS_OUT)) {
    if(data->state.resume_from) {
      fprintf(data->set.err,
              "** Resuming transfer from byte position %" FMT_OFF_T "\n",
              data->state.resume_from);
    }
    fprintf(data->set.err,
            "  %% Total    %% Received %% Xferd  Average Speed   "
            "Time    Time     Time  Current\n"
            "                                 Dload  Upload   "
            "Total   Spent    Left  Speed\n");
    p->flags |= PGRS_HEADERS_OUT; /* headers are shown */
  }

  /* Figure out the estimated time of arrival for upload and download */
  pgrs_estimates(&p->ul, (p->flags & PGRS_UL_SIZE_KNOWN), &ul_estm);
  pgrs_estimates(&p->dl, (p->flags & PGRS_DL_SIZE_KNOWN), &dl_estm);

  /* Since both happen at the same time, total expected duration is max. */
  total_estm.secs = CURLMAX(ul_estm.secs, dl_estm.secs);
  /* create the three time strings */
  time2str(time_left, total_estm.secs > 0 ? (total_estm.secs - cur_secs) : 0);
  time2str(time_total, total_estm.secs);
  time2str(time_spent, cur_secs);

  /* Get the total amount of data expected to get transferred */
  total_expected_size =
    ((p->flags & PGRS_UL_SIZE_KNOWN) ? p->ul.total_size : p->ul.cur_size) +
    ((p->flags & PGRS_DL_SIZE_KNOWN) ? p->dl.total_size : p->dl.cur_size);

  /* We have transferred this much so far */
  total_cur_size = p->dl.cur_size + p->ul.cur_size;

  /* Get the percentage of data transferred so far */
  total_estm.percent = pgrs_est_percent(total_expected_size, total_cur_size);

  fprintf(data->set.err,
          "\r"
          "%3" FMT_OFF_T " %s  "
          "%3" FMT_OFF_T " %s  "
          "%3" FMT_OFF_T " %s  %s  %s %s %s %s %s",
          total_estm.percent, /* 3 letters */           /* total % */
          max5data(total_expected_size, max5[2]),       /* total size */
          dl_estm.percent, /* 3 letters */              /* rcvd % */
          max5data(p->dl.cur_size, max5[0]),            /* rcvd size */
          ul_estm.percent, /* 3 letters */              /* xfer % */
          max5data(p->ul.cur_size, max5[1]),            /* xfer size */
          max5data(p->dl.speed, max5[3]),               /* avrg dl speed */
          max5data(p->ul.speed, max5[4]),               /* avrg ul speed */
          time_total,    /* 8 letters */                /* total time */
          time_spent,    /* 8 letters */                /* time spent */
          time_left,     /* 8 letters */                /* time left */
          max5data(p->current_speed, max5[5])
    );

  /* we flush the output stream to make it appear as soon as possible */
  fflush(data->set.err);
}